

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_list.cpp
# Opt level: O1

Am_Value_List * __thiscall Am_Value_List::operator=(Am_Value_List *this,Am_Value_List *list)

{
  uint *puVar1;
  Am_Value_List_Data *pAVar2;
  Am_Value_List_Data *pAVar3;
  
  pAVar2 = this->data;
  pAVar3 = list->data;
  this->data = pAVar3;
  this->item = list->item;
  if (pAVar3 != (Am_Value_List_Data *)0x0) {
    puVar1 = &(pAVar3->super_Am_Wrapper).refs;
    *puVar1 = *puVar1 + 1;
  }
  if (pAVar2 != (Am_Value_List_Data *)0x0) {
    puVar1 = &(pAVar2->super_Am_Wrapper).refs;
    *puVar1 = *puVar1 - 1;
    if (*puVar1 == 0) {
      (*(pAVar2->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type[4])();
    }
  }
  return this;
}

Assistant:

Am_Value_List &
Am_Value_List::operator=(const Am_Value_List &list)
{
  Am_Value_List_Data *old_data = data;
  data = list.data;
  item = list.item;
  if (data)
    data->Note_Reference();
  if (old_data)
    old_data->Release();
  return *this;
}